

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::TableFunctionExtractor::GetVarArgs
                  (Value *__return_storage_ptr__,TableFunctionCatalogEntry *entry,idx_t offset)

{
  bool bVar1;
  LogicalType local_200;
  string local_1e8;
  TableFunction fun;
  
  FunctionSet<duckdb::TableFunction>::GetFunctionByOffset
            (&fun,&(entry->functions).super_FunctionSet<duckdb::TableFunction>,offset);
  bVar1 = SimpleFunction::HasVarArgs((SimpleFunction *)&fun);
  if (bVar1) {
    LogicalType::ToString_abi_cxx11_
              (&local_1e8,&fun.super_SimpleNamedParameterFunction.super_SimpleFunction.varargs);
    Value::Value(__return_storage_ptr__,&local_1e8);
    ::std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    LogicalType::LogicalType(&local_200,SQLNULL);
    Value::Value(__return_storage_ptr__,&local_200);
    LogicalType::~LogicalType(&local_200);
  }
  TableFunction::~TableFunction(&fun);
  return __return_storage_ptr__;
}

Assistant:

static Value GetVarArgs(TableFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return !fun.HasVarArgs() ? Value() : Value(fun.varargs.ToString());
	}